

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O2

void __thiscall
MacProj::mac_sync_compute
          (MacProj *this,int level,Array<MultiFab_*,_3> *Ucorr,MultiFab *Sync,int comp,int s_ind,
          MultiFab **sync_edges,int eComp,FluxRegister *adv_flux_reg,
          Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *advectionType,Real dt,
          bool update_fluxreg)

{
  AmrLevel *pAVar1;
  pointer pGVar2;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> uVar3;
  MultiFab *pMVar4;
  MultiFab *pMVar5;
  MultiFab *pMVar6;
  MultiFab *pMVar7;
  MultiFab *pMVar8;
  string redistribution_type;
  string redistribution_type_00;
  bool bVar9;
  BoxArray *pBVar10;
  long lVar11;
  MultiFab *pMVar12;
  BCRec *d_bc;
  Geometry *geom;
  undefined1 uVar13;
  undefined7 uVar14;
  undefined1 in_stack_fffffffffffff5d8 [12];
  Real local_9c8;
  DeviceVector<int> iconserv;
  Vector<int,_std::allocator<int>_> iconserv_h;
  string local_978 [32];
  string local_958 [32];
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bcs;
  undefined1 local_7b8 [384];
  MultiFab local_638;
  MultiFab local_4b8 [3];
  
  pAVar1 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
           super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
           super__Vector_impl_data._M_start[level];
  pGVar2 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->parent->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[level]._M_t;
  lVar11 = 0;
  do {
    amrex::MultiFab::MultiFab
              ((MultiFab *)
               ((long)&local_4b8[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar11));
    lVar11 = lVar11 + 0x180;
  } while (lVar11 != 0x480);
  geom = pGVar2 + level;
  pMVar12 = local_4b8;
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    pBVar10 = amrex::AmrLevel::getEdgeBoxArray
                        ((this->LevelData).
                         super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                         super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[level],(int)lVar11);
    bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1;
    bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (*(pMVar12->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
              (pMVar12,pBVar10,&pAVar1->dmap,1,
               (ulong)(uint)((*sync_edges)->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                            n_grow.vect[0],&bcs,
               (int)*(undefined8 *)
                     ((long)uVar3._M_t.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    pMVar12 = pMVar12 + 1;
  }
  bVar9 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"MOL");
  if (bVar9) {
    bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar9 = amrex::EBFArrayBoxFactory::isAllRegular
                      (*(EBFArrayBoxFactory **)
                        ((long)uVar3._M_t.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218
                        ));
    pMVar12 = Ucorr->_M_elems[0];
    pMVar4 = Ucorr->_M_elems[1];
    pMVar5 = Ucorr->_M_elems[2];
    pMVar6 = *sync_edges;
    pMVar7 = sync_edges[1];
    pMVar8 = sync_edges[2];
    if (bVar9) {
      MOL::ComputeSyncAofs
                (Sync,s_ind,1,Sync,s_ind,pMVar12,pMVar4,pMVar5,pMVar12,pMVar4,pMVar5,pMVar6,pMVar7,
                 pMVar8,eComp,true,local_4b8,local_4b8 + 1,local_4b8 + 2,0,&bcs,(BCRec *)0x0,geom,
                 false);
    }
    else {
      uVar13 = 0x9f;
      uVar14 = 0x2637;
      std::__cxx11::string::string
                (local_978,(string *)&NavierStokesBase::redistribution_type_abi_cxx11_);
      redistribution_type._M_string_length._0_1_ = uVar13;
      redistribution_type._M_dataplus._M_p = (pointer)local_978;
      redistribution_type._M_string_length._1_7_ = uVar14;
      redistribution_type.field_2._0_12_ = in_stack_fffffffffffff5d8;
      redistribution_type.field_2._12_4_ = s_ind;
      EBMOL::ComputeSyncAofs
                (Sync,s_ind,1,Sync,s_ind,pMVar12,pMVar4,pMVar5,pMVar12,pMVar4,pMVar5,pMVar6,pMVar7,
                 pMVar8,eComp,true,local_4b8,local_4b8 + 1,local_4b8 + 2,0,&bcs,(BCRec *)0x0,geom,dt
                 ,false,redistribution_type);
      std::__cxx11::string::~string(local_978);
    }
    std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
              ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&bcs);
  }
  else {
    bVar9 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"Godunov_PLM");
    if (!bVar9) {
      bVar9 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"Godunov_PPM");
      if (!bVar9) {
        bVar9 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"BDS");
        if (!bVar9) {
          amrex::Abort_host("MacProj::mac_sync_compute: Unkown adveciton scheme");
          goto LAB_00263cf9;
        }
      }
    }
    if (comp < 3) {
      d_bc = (BCRec *)((long)comp * 0x18 +
                      *(long *)((long)uVar3._M_t.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                               + 0xbc8));
    }
    else {
      d_bc = (BCRec *)(*(long *)((long)uVar3._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                                + 0xbe0) + (ulong)(uint)comp * 0x18 + -0x48);
    }
    iconserv.m_data = (pointer)0x0;
    iconserv.m_size = 0;
    iconserv.m_capacity = 0;
    iconserv_h.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    iconserv_h.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iconserv_h.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::PODVector<int,_std::allocator<int>_>::resize(&iconserv,1);
    bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)bcs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::resize
              (&iconserv_h.super_vector<int,_std::allocator<int>_>,1,(value_type_conflict *)&bcs);
    *iconserv_h.super_vector<int,_std::allocator<int>_>.
     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (uint)((advectionType->super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>).
                super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
                super__Vector_impl_data._M_start[comp] == Conservative);
    if ((long)iconserv_h.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != 0) {
      memcpy(iconserv.m_data,
             iconserv_h.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start,
             (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish -
             (long)iconserv_h.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start);
    }
    bVar9 = amrex::EBFArrayBoxFactory::isAllRegular
                      (*(EBFArrayBoxFactory **)
                        ((long)uVar3._M_t.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218
                        ));
    if (bVar9) {
      bVar9 = std::operator==(&NavierStokesBase::advection_scheme_abi_cxx11_,"BDS");
      if (bVar9) {
        amrex::MultiFab::MultiFab((MultiFab *)&bcs);
        pMVar12 = Ucorr->_M_elems[0];
        pMVar4 = Ucorr->_M_elems[1];
        pMVar5 = Ucorr->_M_elems[2];
        pMVar7 = *sync_edges;
        pMVar8 = sync_edges[1];
        pMVar6 = sync_edges[2];
        amrex::MultiFab::MultiFab(&local_638);
        amrex::MultiFab::MultiFab((MultiFab *)local_7b8);
        BDS::ComputeSyncAofs
                  (Sync,s_ind,1,(MultiFab *)&bcs,s_ind,pMVar12,pMVar4,pMVar5,pMVar12,pMVar4,pMVar5,
                   pMVar7,pMVar8,pMVar6,eComp,true,local_4b8,local_4b8 + 1,local_4b8 + 2,0,
                   &local_638,0,(MultiFab *)local_7b8,d_bc,geom,&iconserv,0.0,false);
      }
      else {
        amrex::MultiFab::MultiFab((MultiFab *)&bcs);
        pMVar12 = Ucorr->_M_elems[0];
        pMVar4 = Ucorr->_M_elems[1];
        pMVar5 = Ucorr->_M_elems[2];
        pMVar7 = *sync_edges;
        pMVar8 = sync_edges[1];
        pMVar6 = sync_edges[2];
        amrex::MultiFab::MultiFab(&local_638);
        amrex::MultiFab::MultiFab((MultiFab *)local_7b8);
        Godunov::ComputeSyncAofs
                  (Sync,s_ind,1,(MultiFab *)&bcs,s_ind,pMVar12,pMVar4,pMVar5,pMVar12,pMVar4,pMVar5,
                   pMVar7,pMVar8,pMVar6,eComp,true,local_4b8,local_4b8 + 1,local_4b8 + 2,0,
                   &local_638,0,(MultiFab *)local_7b8,d_bc,geom,&iconserv,0.0,false,false,false);
      }
      amrex::MultiFab::~MultiFab((MultiFab *)local_7b8);
    }
    else {
      pMVar12 = Ucorr->_M_elems[0];
      pMVar4 = Ucorr->_M_elems[1];
      pMVar5 = Ucorr->_M_elems[2];
      pMVar6 = *sync_edges;
      pMVar7 = sync_edges[1];
      pMVar8 = sync_edges[2];
      amrex::MultiFab::MultiFab((MultiFab *)&bcs);
      amrex::MultiFab::MultiFab(&local_638);
      local_7b8._0_8_ = (pointer)0x0;
      local_7b8._8_8_ = (pointer)0x0;
      local_7b8._16_8_ = 0;
      uVar13 = 0xb9;
      uVar14 = 0x263a;
      std::__cxx11::string::string
                (local_958,(string *)&NavierStokesBase::redistribution_type_abi_cxx11_);
      redistribution_type_00._M_string_length._0_1_ = uVar13;
      redistribution_type_00._M_dataplus._M_p = (pointer)local_958;
      redistribution_type_00._M_string_length._1_7_ = uVar14;
      redistribution_type_00.field_2._0_12_ = in_stack_fffffffffffff5d8;
      redistribution_type_00.field_2._12_4_ = s_ind;
      EBGodunov::ComputeSyncAofs
                (Sync,s_ind,1,Sync,s_ind,pMVar12,pMVar4,pMVar5,pMVar12,pMVar4,pMVar5,pMVar6,pMVar7,
                 pMVar8,eComp,true,local_4b8,local_4b8 + 1,local_4b8 + 2,0,(MultiFab *)&bcs,0,
                 &local_638,(Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_7b8,d_bc,
                 geom,&iconserv,dt,true,redistribution_type_00);
      std::__cxx11::string::~string(local_958);
      std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_7b8);
    }
    amrex::MultiFab::~MultiFab(&local_638);
    amrex::MultiFab::~MultiFab((MultiFab *)&bcs);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&iconserv_h);
    amrex::PODVector<int,_std::allocator<int>_>::~PODVector(&iconserv);
  }
LAB_00263cf9:
  if (update_fluxreg && 0 < level) {
    local_9c8 = -dt;
    pMVar12 = local_4b8;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      amrex::FluxRegister::FineAdd(adv_flux_reg,pMVar12,(int)lVar11,0,comp,1,local_9c8);
      pMVar12 = pMVar12 + 1;
    }
  }
  lVar11 = 0x300;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)
               ((long)&local_4b8[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                       _vptr_FabArrayBase + lVar11));
    lVar11 = lVar11 + -0x180;
  } while (lVar11 != -0x180);
  return;
}

Assistant:

void
MacProj::mac_sync_compute (int                    level,
                           Array<MultiFab*,AMREX_SPACEDIM>& Ucorr,
                           MultiFab&              Sync,
                           int                    comp,
                           int                    s_ind,
                           MultiFab* const*       sync_edges,
                           int                    eComp,
                           FluxRegister*          adv_flux_reg,
                           Vector<AdvectionForm>& advectionType,
                           Real                   dt,
                           bool                   update_fluxreg)
{
    const DistributionMapping& dmap     = LevelData[level]->DistributionMap();
    const Geometry& geom         = parent->Geom(level);
    NavierStokesBase& ns_level   = *(NavierStokesBase*) &(parent->getLevel(level));

    const int  ncomp   = 1;         // Number of components to process at once

    MultiFab fluxes[AMREX_SPACEDIM];
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        const BoxArray& ba = LevelData[level]->getEdgeBoxArray(i);
        fluxes[i].define(ba, dmap, 1, sync_edges[0]->nGrow(), MFInfo(),ns_level.Factory());
    }

    //
    // Compute the mac sync correction.
    //
    if ( ns_level.advection_scheme == "MOL" )
    {
        // Bogus arguments -- they will not be used since we don't need to recompute the edge states
        Vector<BCRec>  bcs;
        BCRec  const* d_bcrec_ptr = NULL;

#ifdef AMREX_USE_EB
        if ( !(ns_level.EBFactory().isAllRegular()) )
        {
          EBMOL::ComputeSyncAofs(Sync, s_ind, ncomp,
                                 Sync, s_ind, // this is not used when we pass edge states
                                 D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),  // this is not used when we pass edge states
                                 D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                 D_DECL(*sync_edges[0],*sync_edges[1],*sync_edges[2]), eComp, true,
                                 D_DECL(fluxes[0],fluxes[1],fluxes[2]), 0,
                                 bcs, d_bcrec_ptr, geom, dt,
                                 false,  // not used when we pass edge states
                                 ns_level.redistribution_type);
        }
        else
#endif
        {
          MOL::ComputeSyncAofs(Sync, s_ind, ncomp,
                               Sync, s_ind, // this is not used when we pass edge states
                               D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),  // this is not used when we pass edge states
                               D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                               D_DECL(*sync_edges[0],*sync_edges[1],*sync_edges[2]), eComp, true,
                               D_DECL(fluxes[0],fluxes[1],fluxes[2]), 0,
                               bcs, d_bcrec_ptr, geom,
                               false ); // not used when we pass edge states
        }

    }
    else if ( ns_level.advection_scheme == "Godunov_PLM" ||
              ns_level.advection_scheme == "Godunov_PPM" ||
              ns_level.advection_scheme == "BDS")
    {
        // Possibly unsused  arguments -- used only in EB case since we don't need to recompute the edge states
        const int  sync_comp   = comp < AMREX_SPACEDIM ? comp   : comp-AMREX_SPACEDIM;
        BCRec  const* d_bcrec_ptr = comp < AMREX_SPACEDIM
                                           ? &(ns_level.get_bcrec_velocity_d_ptr())[sync_comp]
                                           : &(ns_level.get_bcrec_scalars_d_ptr())[sync_comp];

        Gpu::DeviceVector<int> iconserv;
        Vector<int> iconserv_h;
        iconserv.resize(ncomp);
        iconserv_h.resize(ncomp, 0);
        for (int i = 0; i < ncomp; ++i) {
            iconserv_h[i] = (advectionType[comp+i] == Conservative) ? 1 : 0;
        }
        Gpu::copy(Gpu::hostToDevice, iconserv_h.begin(), iconserv_h.end(), iconserv.begin());

#ifdef AMREX_USE_EB
        if ( !(ns_level.EBFactory().isAllRegular()) )
        {
          EBGodunov::ComputeSyncAofs(Sync, s_ind, ncomp,
                                     Sync, s_ind,                      // this is not used when known_edgestate = true
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),  // this is not used when we pass edge states
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                     AMREX_D_DECL(*sync_edges[0],*sync_edges[1],*sync_edges[2]), eComp, true,
                                     AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), 0,
                                     MultiFab(), 0, MultiFab(),                        // this is not used when known_edgestate = true
                                     {}, d_bcrec_ptr,
                                     geom, iconserv, dt, true,
                                     ns_level.redistribution_type);
        }
        else
#endif
        if (ns_level.advection_scheme == "BDS")
        {
            BDS::ComputeSyncAofs(Sync, s_ind, ncomp,
                                 MultiFab(), s_ind,                      // this is not used when known_edgestate = true
                                 AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),  // this is not used when we pass edge states
                                 AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                 AMREX_D_DECL(*sync_edges[0],*sync_edges[1],*sync_edges[2]), eComp, true,
                                 AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), 0,
                                 MultiFab(), 0, MultiFab(),                        // this is not used when known_edgestate = true
                                 d_bcrec_ptr, geom, iconserv, 0.0, false); // this is not used when known_edgestate = true
        }
        else
        {
            Godunov::ComputeSyncAofs(Sync, s_ind, ncomp,
                                     MultiFab(), s_ind,                      // this is not used when known_edgestate = true
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),  // this is not used when we pass edge states
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                     AMREX_D_DECL(*sync_edges[0],*sync_edges[1],*sync_edges[2]), eComp, true,
                                     AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), 0,
                                     MultiFab(), 0, MultiFab(),                        // this is not used when known_edgestate = true
                                     d_bcrec_ptr, geom, iconserv, 0.0, false, false, false  ); // this is not used when known_edgestate = true
        }
    }
    else
    {
        Abort("MacProj::mac_sync_compute: Unkown adveciton scheme");
    }


    if (level > 0 && update_fluxreg)
    {
        for (int d = 0; d < AMREX_SPACEDIM; ++d)
        {
            adv_flux_reg->FineAdd(fluxes[d],d,0,comp,1,-dt);
        }
    }
}